

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

ServiceFlags __thiscall
anon_unknown.dwarf_2e8af7c::PeerManagerImpl::GetDesirableServiceFlags
          (PeerManagerImpl *this,ServiceFlags services)

{
  long lVar1;
  time_point tVar2;
  ServiceFlags SVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uint)services >> 10 & 1) != 0) {
    tVar2 = NodeClock::now();
    SVar3 = NODE_NETWORK_LIMITED|NODE_WITNESS;
    if (((long)tVar2.__d.__r / 1000000000 - (this->m_best_block_time)._M_i.__r) /
        (this->m_chainparams->consensus).nPowTargetSpacing < 0x90) goto LAB_008fe4e4;
  }
  SVar3 = NODE_WITNESS|NODE_NETWORK;
LAB_008fe4e4:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

ServiceFlags PeerManagerImpl::GetDesirableServiceFlags(ServiceFlags services) const
{
    if (services & NODE_NETWORK_LIMITED) {
        // Limited peers are desirable when we are close to the tip.
        if (ApproximateBestBlockDepth() < NODE_NETWORK_LIMITED_ALLOW_CONN_BLOCKS) {
            return ServiceFlags(NODE_NETWORK_LIMITED | NODE_WITNESS);
        }
    }
    return ServiceFlags(NODE_NETWORK | NODE_WITNESS);
}